

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::TriaO1::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,TriaO1 *this,RefinementPattern *ref_pat,dim_t codim)

{
  XprTypeNested pMVar1;
  double *pdVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  _Alloc_hider _Var5;
  dim_t dVar6;
  uint uVar7;
  uint uVar8;
  TriaO1 *pTVar9;
  runtime_error *prVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  MatrixXd child_geo;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  stringstream ss;
  string local_280;
  string local_260;
  dim_t local_23c;
  string local_238;
  scalar_product_op<double,_double> local_211;
  vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
  *local_210;
  _func_int **local_208;
  ulong local_200;
  double local_1f8;
  TriaO1 *local_1f0;
  long local_1e8;
  long local_1e0;
  scalar_constant_op<double> local_1d0;
  Rhs local_1c8;
  undefined1 local_1b8 [392];
  
  local_210 = (vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
               *)__return_storage_ptr__;
  local_1f0 = this;
  if (ref_pat[8] != (RefinementPattern)0x3) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Refinement pattern for ",0x17);
    local_260._M_dataplus._M_p._0_1_ = ref_pat[8];
    base::RefEl::ToString_abi_cxx11_(&local_280,(RefEl *)&local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),local_280._M_dataplus._M_p,local_280._M_string_length);
    paVar3 = &local_280.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar3) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    local_280._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"ref_pat.RefEl() == lf::base::RefEl::kTria()","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_280,&local_260,0x67,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar3) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_23c = codim;
  if (2 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Illegal codim ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"codim < 3","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_280,&local_260,0x68,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar15 = *(uint *)(ref_pat + 0xc);
  (**(code **)(*(long *)ref_pat + 8))(&local_1e8,ref_pat,codim);
  uVar7 = base::narrow<unsigned_int,unsigned_long>
                    ((local_1e0 - local_1e8 >> 3) * -0x5555555555555555);
  uVar8 = (*(code *)**(undefined8 **)ref_pat)(ref_pat,codim);
  if (uVar7 != uVar8) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"no_children = ",0xe);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," <-> ",5);
    (*(code *)**(undefined8 **)ref_pat)(ref_pat,local_23c);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"no_children == ref_pat.NumChildren(codim)","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_280,&local_260,0x72,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)local_210 = 0;
  *(pointer *)(local_210 + 8) = (pointer)0x0;
  *(pointer *)(local_210 + 0x10) = (pointer)0x0;
  if (uVar7 != 0) {
    local_1f8 = 1.0 / (double)uVar15;
    uVar15 = 3 - local_23c;
    local_200 = (ulong)uVar7;
    uVar13 = 0;
    local_208 = (_func_int **)&PTR_DimLocal_004a65f8;
    do {
      dVar6 = local_23c;
      if (*(long *)(local_1e8 + 8 + uVar13 * 0x18) != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"child_polygons[l].rows() = ",0x1b);
        std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"child_polygons[l].rows() == 2","");
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_280,&local_260,0x7c,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pMVar1 = (XprTypeNested)(local_1e8 + uVar13 * 0x18);
      if (*(ulong *)(pMVar1 + 0x10) != (ulong)uVar15) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"child_polygons[l].cols() = ",0x1b);
        std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"child_polygons[l].cols() == 3 - codim","");
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_280,&local_260,0x7e,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1d0.m_other = local_1f8;
      local_1c8.m_xpr = pMVar1;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_280,2,(ulong)uVar15,&local_1d0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                       *)local_1b8,(Lhs *)&local_280,&local_1c8,&local_211);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_238,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)local_1b8);
      (*(local_1f0->super_Geometry)._vptr_Geometry[3])(&local_260,local_1f0,&local_238);
      free(local_238._M_dataplus._M_p);
      if (dVar6 == 0) {
        pTVar9 = (TriaO1 *)operator_new(0x40);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1b8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_260);
        TriaO1(pTVar9,(Matrix<double,__1,_3,_0,__1,_3> *)local_1b8);
        free((void *)local_1b8._0_8_);
        local_280._M_dataplus._M_p = (pointer)pTVar9;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_210,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)&local_280);
      }
      else if (dVar6 == 1) {
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_280);
        local_1b8._0_8_ = local_280._M_dataplus._M_p;
        local_280._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_210,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_1b8);
        if ((TriaO1 *)local_1b8._0_8_ != (TriaO1 *)0x0) {
          (*((Geometry *)local_1b8._0_8_)->_vptr_Geometry[0xb])();
        }
        local_1b8._0_8_ = (double *)0x0;
      }
      else {
        pTVar9 = (TriaO1 *)operator_new(0x18);
        local_1b8._0_8_ = (double *)0x0;
        local_1b8._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1b8,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_260);
        _Var5._M_p = local_260._M_dataplus._M_p;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_260,
                   (assign_op<double,_double> *)&local_238);
        uVar12 = local_1b8._8_8_ - ((long)local_1b8._8_8_ >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)local_1b8._8_8_) {
          lVar14 = 0;
          do {
            pdVar2 = (double *)(_Var5._M_p + lVar14 * 8);
            dVar4 = pdVar2[1];
            *(double *)(local_1b8._0_8_ + lVar14 * 8) = *pdVar2;
            ((double *)(local_1b8._0_8_ + lVar14 * 8))[1] = dVar4;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)uVar12);
        }
        if ((long)uVar12 < (long)local_1b8._8_8_) {
          do {
            *(double *)(local_1b8._0_8_ + uVar12 * 8) = *(double *)(_Var5._M_p + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (local_1b8._8_8_ != uVar12);
        }
        (pTVar9->super_Geometry)._vptr_Geometry = local_208;
        (pTVar9->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
        m_data = (double *)local_1b8._0_8_;
        (pTVar9->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
        m_rows = local_1b8._8_8_;
        local_280._M_dataplus._M_p = (pointer)pTVar9;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_210,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)&local_280);
      }
      if ((TriaO1 *)local_280._M_dataplus._M_p != (TriaO1 *)0x0) {
        (**(code **)(*(long *)local_280._M_dataplus._M_p + 0x58))();
      }
      free(local_260._M_dataplus._M_p);
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_200);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             *)&local_1e8);
  return (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          *)local_210;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> TriaO1::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  // The refinement pattern must be for a triangle
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kTria(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);
  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Obtain geometry of children as lattice polygon
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child segments
  const auto no_children = base::narrow<base::size_type>(child_polygons.size());
  LF_VERIFY_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));
  // return variable
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  // For each child triangle create a geometry object and a unique pointer to
  // it.
  for (int l = 0; l < no_children; l++) {
    // A single child triangle is described by a lattice polygon with
    // three vertices, a child segment by a polygon with two vertices,
    // a child point by a single point = "polygon with one corner"
    LF_VERIFY_MSG(child_polygons[l].rows() == 2,
                  "child_polygons[l].rows() = " << child_polygons[l].rows());
    LF_VERIFY_MSG(child_polygons[l].cols() == 3 - codim,
                  "child_polygons[l].cols() = " << child_polygons[l].cols());
    // Normalize lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[l].cast<double>()));
    switch (codim) {
      case 0: {
        // child is a triangle
        child_geo_uptrs.push_back(std::make_unique<TriaO1>(child_geo));
        break;
      }
      case 1: {
        // child is an edge
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 2: {
        // child is a node
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default:
        LF_VERIFY_MSG(false, "codim out of bounds.");
    }  // end switch codim
  }  // end loop over the children
  return (child_geo_uptrs);
}